

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRRect.cpp
# Opt level: O0

ssize_t __thiscall MinVR::VRRect::write(VRRect *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  VRDataIndex *this_00;
  char *in_stack_fffffffffffffe50;
  VRDataIndex *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  VRFloat value;
  string local_168 [32];
  string local_148 [32];
  string local_128 [32];
  string local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [32];
  void *local_18;
  VRDataIndex *local_10;
  VRRect *local_8;
  
  this_00 = (VRDataIndex *)CONCAT44(in_register_00000034,__fd);
  local_18 = __buf;
  local_10 = this_00;
  local_8 = this;
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  value = (VRFloat)((ulong)__buf >> 0x20);
  VRDataIndex::addData(this_00,(string *)this,value);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  VRDataIndex::addData(this_00,(string *)this,value);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  __lhs = &local_e8;
  __rhs = local_10;
  std::operator+(__lhs,(char *)local_10);
  VRDataIndex::addData(this_00,(string *)this,value);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::operator+(__lhs,(char *)__rhs);
  VRDataIndex::addData(this_00,(string *)this,value);
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_128);
  std::operator+(__lhs,(char *)__rhs);
  VRDataIndex::addData(this_00,(string *)this,(VRInt)value);
  std::__cxx11::string::~string(local_148);
  sVar1 = std::__cxx11::string::~string(local_168);
  return sVar1;
}

Assistant:

void VRRect::write(VRDataIndex& index, std::string name) const {
	index.addData(name + "/xOffset", m_xOffset);
	index.addData(name + "/yOffset", m_yOffset);
	index.addData(name + "/width", m_width);
	index.addData(name + "/height", m_height);
	index.addData(name + "/usePercent", m_usePercent);
}